

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeinfo.cpp
# Opt level: O0

void __thiscall hbm::streaming::timeInfo::set(timeInfo *this,Value *timeObject)

{
  bool bVar1;
  UInt UVar2;
  Value *pVVar3;
  Value *pVVar4;
  Value *in_RDI;
  runtime_error *e;
  Value value;
  uint32_t fraction;
  uint32_t seconds;
  Value *stmapNode;
  Value *in_stack_00000518;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Value *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  ValueType in_stack_fffffffffffffe8c;
  Value *in_stack_fffffffffffffe90;
  UInt in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 uVar5;
  Value *in_stack_fffffffffffffeb0;
  Value *in_stack_fffffffffffffef8;
  Value *in_stack_ffffffffffffff00;
  Value local_80;
  uint local_58;
  UInt local_54;
  Value *local_18;
  
  local_18 = Json::Value::operator[]
                       ((Value *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                        (char *)in_stack_fffffffffffffe90);
  pVVar3 = Json::Value::operator[]
                     ((Value *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                      (char *)in_stack_fffffffffffffe90);
  Json::Value::Value(in_stack_fffffffffffffe90,
                     (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  bVar1 = Json::Value::operator==(in_RDI,pVVar3);
  Json::Value::~Value(in_stack_fffffffffffffeb0);
  if (bVar1) {
    local_54 = 0;
    local_58 = 0;
    Json::Value::Value(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    pVVar3 = Json::Value::operator[]
                       ((Value *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                        (char *)in_stack_fffffffffffffe90);
    Json::Value::Value(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Json::Value::operator=
              (in_stack_fffffffffffffe80,
               (Value *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Json::Value::~Value(pVVar3);
    bVar1 = Json::Value::isNull(&local_80);
    if (bVar1) {
      *(undefined4 *)&in_RDI->value_ = 0;
    }
    else {
      UVar2 = Json::Value::asUInt(in_stack_00000518);
      *(UInt *)&in_RDI->value_ = UVar2;
    }
    Json::Value::operator[]
              ((Value *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (char *)in_stack_fffffffffffffe90);
    Json::Value::Value(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Json::Value::operator=
              (in_stack_fffffffffffffe80,
               (Value *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Json::Value::~Value(pVVar3);
    bVar1 = Json::Value::isNull(&local_80);
    uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe9c);
    if (!bVar1) {
      in_stack_fffffffffffffe98 = Json::Value::asUInt(in_stack_00000518);
      local_54 = in_stack_fffffffffffffe98;
    }
    pVVar4 = Json::Value::operator[]
                       ((Value *)CONCAT44(uVar5,in_stack_fffffffffffffe98),
                        (char *)in_stack_fffffffffffffe90);
    Json::Value::Value(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Json::Value::operator=
              (in_stack_fffffffffffffe80,
               (Value *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Json::Value::~Value(pVVar3);
    bVar1 = Json::Value::isNull(&local_80);
    if (!bVar1) {
      local_58 = Json::Value::asUInt(in_stack_00000518);
    }
    *(ulong *)&in_RDI->field_0x8 = (ulong)local_54;
    *(long *)&in_RDI->field_0x8 = *(long *)&in_RDI->field_0x8 << 0x20;
    *(ulong *)&in_RDI->field_0x8 = *(ulong *)&in_RDI->field_0x8 | (ulong)local_58;
    pVVar4 = Json::Value::operator[]
                       ((Value *)CONCAT44(uVar5,in_stack_fffffffffffffe98),(char *)pVVar4);
    Json::Value::Value(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Json::Value::operator=
              (pVVar4,(Value *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Json::Value::~Value(pVVar3);
    bVar1 = Json::Value::isNull(&local_80);
    if (bVar1) {
      *(undefined4 *)&in_RDI->comments_ = 0;
    }
    else {
      UVar2 = Json::Value::asUInt(in_stack_00000518);
      *(UInt *)&in_RDI->comments_ = UVar2;
    }
    Json::Value::~Value(pVVar3);
  }
  return;
}

Assistant:

void timeInfo::set(const Json::Value& timeObject)
		{
			try {
				const Json::Value& stmapNode = timeObject["stamp"];
				if(stmapNode["type"]=="ntp") {
					uint32_t seconds = 0;
					uint32_t fraction = 0;
					Json::Value value;
					value = stmapNode["era"];
					if(value.isNull()) {
						m_era = 0;
					} else {
						m_era = value.asUInt();
					}

					value = stmapNode["seconds"];
					if(value.isNull()==false) {
						seconds = value.asUInt();
					}

					value = stmapNode["fraction"];
					if(value.isNull()==false) {
						fraction = value.asUInt();
					}
					m_ntpTimestamp = seconds;
					m_ntpTimestamp <<= 32;
					m_ntpTimestamp |= fraction;

					value = stmapNode["subFraction"];
					if(value.isNull()) {
						m_subFraction = 0;
					} else {
						m_subFraction = value.asUInt();
					}
				}
			} catch(const std::runtime_error& e) {
				std::cerr << e.what();
			}
		}